

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_v4_serial.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  ulong uVar10;
  size_type sVar11;
  size_type sVar12;
  reference pvVar13;
  reference piVar14;
  ostream *this;
  ostream *this_00;
  undefined8 *in_RSI;
  int in_EDI;
  bool bVar15;
  rep_conflict rVar16;
  duration<double,_std::ratio<1L,_1L>_> elapsed;
  time_point stop;
  int res;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int value;
  int col;
  int row;
  int j_1;
  int mul_value;
  int n;
  int m;
  int s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> k;
  int a_col;
  int a_row;
  int j;
  time_point start;
  vector<int,_std::allocator<int>_> result_vector;
  vector<int,_std::allocator<int>_> ones;
  vector<int,_std::allocator<int>_> c3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> c_values;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cscColumn;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cscRow;
  vector<double,_std::allocator<double>_> val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> J;
  vector<unsigned_int,_std::allocator<unsigned_int>_> I;
  uint32_t i;
  int nnz;
  int N;
  int M;
  FILE *f;
  MM_typecode matcode;
  int ret_code;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffa0c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa10;
  allocator_type *in_stack_fffffffffffffa18;
  allocator_type *in_stack_fffffffffffffa20;
  size_type in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  allocator_type *in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  value_type vVar18;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffa48;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffa50;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffa58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffa60;
  const_iterator in_stack_fffffffffffffa68;
  duration<double,_std::ratio<1L,_1L>_> local_2f0;
  undefined8 local_2e8;
  int local_2e0;
  int local_2dc;
  int *local_2d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2d0;
  undefined1 *local_2c8;
  value_type local_2bc;
  uint local_2b8;
  value_type local_2b4;
  uint local_2b0;
  value_type local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  uint local_25c;
  value_type local_258;
  uint local_254;
  undefined8 local_250;
  undefined4 local_224;
  undefined1 local_220 [28];
  undefined4 local_204;
  uint *local_1c8;
  uint *local_1c0;
  uint *local_1b8;
  uint *local_1b0;
  uint *local_1a0;
  uint *local_198;
  uint *local_190;
  uint *local_188;
  uint *local_170;
  uint *local_168;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100 [5];
  vector<double,_std::allocator<double>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  uint local_30;
  uint local_2c;
  uint32_t local_28;
  uint32_t local_24;
  FILE *local_20;
  char local_18;
  char local_17;
  char local_16;
  int local_14;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1023be);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1023cb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1023d8);
  if (local_8 < 2) {
    fprintf(_stderr,"Usage: %s [martix-market-filename] [0 for binary or 1 for non binary]\n",
            *local_10);
    exit(1);
  }
  local_20 = fopen((char *)local_10[1],"r");
  if (local_20 == (FILE *)0x0) {
    exit(1);
  }
  iVar3 = mm_read_banner((FILE *)local_20,(MM_typecode *)&local_18);
  if (iVar3 != 0) {
    printf("Could not process Matrix Market banner.\n");
    exit(1);
  }
  if (((local_16 == 'C') && (local_18 == 'M')) && (local_17 == 'C')) {
    printf("Sorry, this application does not support ");
    pcVar4 = mm_typecode_to_str(&local_18);
    printf("Market Market type: [%s]\n",pcVar4);
    exit(1);
  }
  local_14 = mm_read_mtx_crd_size
                       ((FILE *)local_20,(int *)&local_24,(int *)&local_28,(int *)&local_2c);
  if (local_14 == 0) {
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x102590);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa20,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa20);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1025e6);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10260b);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa20,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa20);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x102661);
    std::allocator<double>::allocator((allocator<double> *)0x102686);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,(allocator_type *)in_stack_fffffffffffffa20);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa20,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa18);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa20);
    std::allocator<double>::~allocator((allocator<double> *)0x1026dc);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x102704);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x102730);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x102758);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x102784);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x102799);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1027c1);
    if (local_16 == 'P') {
      for (local_30 = 0; pFVar2 = local_20, local_30 < local_2c; local_30 = local_30 + 1) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_48,(ulong)local_30);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_60,(ulong)local_30);
        __isoc99_fscanf(pFVar2,"%d %d\n",pvVar5,pvVar6);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,(ulong)local_30)
        ;
        *pvVar7 = 1.0;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_48,(ulong)local_30);
        *pvVar5 = *pvVar5 - 1;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_60,(ulong)local_30);
        *pvVar5 = *pvVar5 - 1;
      }
    }
    else {
      for (local_30 = 0; pFVar2 = local_20, local_30 < local_2c; local_30 = local_30 + 1) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_48,(ulong)local_30);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_60,(ulong)local_30);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,(ulong)local_30)
        ;
        __isoc99_fscanf(pFVar2,"%d %d %lg\n",pvVar5,pvVar6,pvVar7);
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_48,(ulong)local_30);
        *pvVar5 = *pvVar5 - 1;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_60,(ulong)local_30);
        *pvVar5 = *pvVar5 - 1;
      }
    }
    if (local_20 != _stdin) {
      fclose(local_20);
    }
    if (local_24 != local_28) {
      printf("COO matrix\' columns and rows are not the same");
    }
    local_168 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    local_170 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x102b58);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa38);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x102b8c);
    local_188 = (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffa10,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    local_190 = (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    local_198 = (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    local_1a0 = (uint *)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                        insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                                  (in_stack_fffffffffffffa50._M_current,in_stack_fffffffffffffa68,
                                   in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    local_1b0 = (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffa10,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    local_1b8 = (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    local_1c0 = (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    local_1c8 = (uint *)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                        insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                                  (in_stack_fffffffffffffa50._M_current,in_stack_fffffffffffffa68,
                                   in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x102d2b);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_48,0);
    uVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_60,0);
    if (uVar1 < *pvVar5) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_100,0);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_120,0);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_48,0);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_60,0);
      uVar17 = 0;
      coo2csc(pvVar5,pvVar6,pvVar8,pvVar9,local_2c * 2,local_24,0);
    }
    else {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_100,0);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_120,0);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_60,0);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_48,0);
      uVar17 = 0;
      coo2csc(pvVar5,pvVar6,pvVar8,pvVar9,local_2c * 2,local_28,0);
    }
    std::allocator<int>::allocator((allocator<int> *)0x102f1f);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,(allocator_type *)in_stack_fffffffffffffa20);
    std::allocator<int>::~allocator((allocator<int> *)0x102f47);
    local_204 = 1;
    std::allocator<int>::allocator((allocator<int> *)0x102f77);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,(value_type_conflict2 *)in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa18);
    std::allocator<int>::~allocator((allocator<int> *)0x102fab);
    local_224 = 0;
    std::allocator<int>::allocator((allocator<int> *)0x102fdb);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,(value_type_conflict2 *)in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa18);
    std::allocator<int>::~allocator((allocator<int> *)0x10300f);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x103037);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa20,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa20);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x103085);
    local_250 = std::chrono::_V2::system_clock::now();
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      local_254 = 0;
      while( true ) {
        uVar1 = local_254;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        vVar18 = *pvVar5;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        if (vVar18 - *pvVar5 <= uVar1) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa10,
                   CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        local_258 = *pvVar5;
        local_25c = local_30;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa10,
                   CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa10,
                   CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10322b);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x103257);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa10,
                   CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa10,
                   CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1032da);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x103306);
        for (local_2a0 = 0; uVar10 = (ulong)local_2a0,
            sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_278),
            uVar10 < sVar11; local_2a0 = local_2a0 + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
          vVar18 = *pvVar5;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&local_278,(long)local_2a0);
          *pvVar5 = vVar18;
        }
        for (local_2a0 = 0; uVar10 = (ulong)local_2a0,
            sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_298),
            uVar10 < sVar11; local_2a0 = local_2a0 + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
          vVar18 = *pvVar5;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&local_298,(long)local_2a0);
          *pvVar5 = vVar18;
        }
        local_2a4 = 0;
        local_2a8 = 0;
        local_2ac = 0;
        while( true ) {
          sVar11 = (size_type)local_2a4;
          sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_278);
          bVar15 = false;
          if (sVar11 != sVar12) {
            sVar11 = (size_type)local_2a8;
            sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_298);
            bVar15 = sVar11 != sVar12;
          }
          vVar18 = local_2ac;
          if (!bVar15) break;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&local_278,(long)local_2a4);
          vVar18 = *pvVar5;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&local_298,(long)local_2a8);
          if (vVar18 == *pvVar5) {
            local_2ac = local_2ac + 1;
            local_2a4 = local_2a4 + 1;
            local_2a8 = local_2a8 + 1;
          }
          else {
            pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&local_278,(long)local_2a4);
            uVar1 = *pvVar5;
            pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&local_298,(long)local_2a8);
            if (*pvVar5 < uVar1) {
              local_2a8 = local_2a8 + 1;
            }
            else {
              local_2a4 = local_2a4 + 1;
            }
          }
        }
        if (local_2ac != 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
          *pvVar5 = vVar18;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa20)
        ;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa20)
        ;
        local_254 = local_254 + 1;
      }
    }
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      local_2b0 = 0;
      while( true ) {
        uVar1 = local_2b0;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        vVar18 = *pvVar5;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        if (vVar18 - *pvVar5 <= uVar1) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa10,
                   CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        local_2b4 = *pvVar5;
        local_2b8 = local_30;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa10,
                   CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        vVar18 = *pvVar5;
        local_2bc = vVar18;
        pvVar13 = std::vector<int,_std::allocator<int>_>::at
                            (in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        iVar3 = vVar18 * *pvVar13;
        pvVar13 = std::vector<int,_std::allocator<int>_>::at
                            (in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar17));
        *pvVar13 = iVar3 + *pvVar13;
        local_2b0 = local_2b0 + 1;
      }
    }
    local_2c8 = local_220;
    local_2d0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffa0c,uVar17));
    local_2d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffffa0c,uVar17));
    while (bVar15 = __gnu_cxx::operator!=
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               in_stack_fffffffffffffa10,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               CONCAT44(in_stack_fffffffffffffa0c,uVar17)), bVar15) {
      piVar14 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_2d0);
      local_2dc = *piVar14;
      local_2e0 = local_2dc / 2;
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_fffffffffffffa10,
                 (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffa0c,uVar17));
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_2d0);
    }
    local_2e8 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffa18,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffa10);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffa20,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffa18);
    this = std::operator<<((ostream *)&std::cout,"Took ");
    rVar16 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_2f0);
    this_00 = (ostream *)std::ostream::operator<<(this,rVar16);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    return local_4;
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv){
    int ret_code;
    MM_typecode matcode;
    FILE *f;
    int M, N, nnz;
    uint32_t i;
    std::vector<uint32_t> I, J;
    std::vector<double> val;

    if (argc < 2)
    {
        fprintf(stderr, "Usage: %s [martix-market-filename] [0 for binary or 1 for non binary]\n", argv[0]);
        exit(1);
    }
    else
    {
        if ((f = fopen(argv[1], "r")) == nullptr)
            exit(1);
    }

    if (mm_read_banner(f, &matcode) != 0)
    {
        printf("Could not process Matrix Market banner.\n");
        exit(1);
    }


    /*  This is how one can screen matrix types if their application */
    /*  only supports a subset of the Matrix Market data types.      */

    if (mm_is_complex(matcode) && mm_is_matrix(matcode) &&
        mm_is_sparse(matcode) )
    {
        printf("Sorry, this application does not support ");
        printf("Market Market type: [%s]\n", mm_typecode_to_str(matcode));
        exit(1);
    }

    /* find out size of sparse matrix .... */

    if ((ret_code = mm_read_mtx_crd_size(f, &M, &N, &nnz)) != 0)
        exit(1);


    I = std::vector<uint32_t>(nnz);
    J = std::vector<uint32_t>(nnz);
    val = std::vector<double>(nnz);

    std::vector<uint32_t> cscRow = std::vector<uint32_t>(2*nnz);
    std::vector<uint32_t> cscColumn = std::vector<uint32_t>(N+1);
    std::vector<uint32_t> c_values = std::vector<uint32_t>(0);

    /* NOTE: when reading in doubles, ANSI C requires the use of the "l"  */
    /*   specifier as in "%lg", "%lf", "%le", otherwise errors will occur */
    /*  (ANSI C X3.159-1989, Sec. 4.9.6.2, p. 136 lines 13-15)            */

    /* Replace missing val column with 1s and change the fscanf to match pattern matrices*/

    if (!mm_is_pattern(matcode)) {
        for (i = 0; i < nnz; i++) {
            fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i]);
            I[i]--;  /* adjust from 1-based to 0-based */
            J[i]--;
        }
    } else {
        for (i = 0; i < nnz; i++) {
            fscanf(f, "%d %d\n", &I[i], &J[i]);
            val[i] = 1;
            I[i]--;  /* adjust from 1-based to 0-based */
            J[i]--;
        }
    }

    if (f !=stdin) fclose(f);

    if(M != N) {
        printf("COO matrix' columns and rows are not the same");
    }

    // create symmetric values
    std::vector<uint32_t> temp1 = std::vector<uint32_t>(I.begin(), I.end());
    I.insert(std::end(I), std::begin(J), std::end(J));
    J.insert(std::end(J), std::begin(temp1), std::end(temp1));
    temp1.clear();

    if (I[0] < J[0]) {
        coo2csc(&cscRow[0], &cscColumn[0], &I[0], &J[0], 2 * nnz, M, 0);
    } else {
        coo2csc(&cscRow[0], &cscColumn[0], &J[0], &I[0], 2 * nnz, N, 0);
    }

    std::vector<int>c3 = std::vector<int>(0);
    std::vector<int>ones = std::vector<int>(N, 1);
    std::vector<int>result_vector = std::vector<int>(N, 0);
    c_values = std::vector<uint32_t>(2*nnz);

    auto start = std::chrono::high_resolution_clock::now();

    for(i = 0; i < N; i++) {
        for(int j = 0; j < cscColumn.at(i+1) - cscColumn.at(i); j++) {
            int a_row = cscRow.at(cscColumn.at(i) + j);
            int a_col = i;

            std::vector<uint32_t> k = std::vector<uint32_t>(cscColumn.at(a_row+1) - cscColumn.at(a_row));
            std::vector<uint32_t> l = std::vector<uint32_t>(cscColumn.at(a_col+1) - cscColumn.at(a_col));

            int s;
            for(s = 0; s < k.size(); ++s) {
                k[s] = cscRow.at(cscColumn.at(a_row) + s);
            }
            for(s = 0; s < l.size(); ++s) {
                l[s] = cscRow.at(cscColumn.at(a_col) + s);
            }

            int m = 0;
            int n = 0;
            int mul_value = 0;

            while(m != k.size() && n != l.size()) {
                if(k[m] == l[n]) {
                    ++mul_value;
                    ++m;
                    ++n;
                } else if(k[m] > l[n]) {
                    ++n;
                } else{
                    ++m;
                }
            }

            if(mul_value) {
                c_values.at(cscColumn.at(i) + j) = mul_value;
            }
        }
    }

    for(i = 0; i < N; i++) {
        for(int j = 0; j < cscColumn.at(i+1) - cscColumn.at(i); j++) {
            int row = cscRow.at(cscColumn.at(i) + j);
            int col = i;
            int value = c_values.at(cscColumn.at(i) + j);
            result_vector.at(row) += value * ones.at(col);
        }
    }

    for(int res: result_vector){
        c3.push_back(res/2);
    }

    auto stop = std::chrono::high_resolution_clock::now();

    std::chrono::duration<double> elapsed = stop - start;
    std::cout<<"Took "<< elapsed.count() <<std::endl;

//    for(int item: c3){
//        std::cout<< item << " ";
//    }
    std::cout<<std::endl;

    return 0;
}